

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebBinder.cpp
# Opt level: O1

string * __thiscall WebBinder::getPath(string *__return_storage_ptr__,WebBinder *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  long *plVar7;
  size_type *psVar8;
  size_type *psVar9;
  string *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  regex fileRegex;
  string regexString;
  regex dirRegex;
  string local_d8;
  string *local_b0;
  string local_a8;
  string *local_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  pointer local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  ppVar2 = (this->binds).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->binds).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar12 = ppVar2 == local_58;
  local_b0 = __return_storage_ptr__;
  local_88 = path;
  if (!bVar12) {
    paVar1 = &local_d8.field_2;
    local_60 = &__return_storage_ptr__->field_2;
    psVar9 = &(ppVar2->second)._M_string_length;
    do {
      paVar11 = &local_a8.field_2;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,psVar9[-5],psVar9[-4] + psVar9[-5]);
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"*","");
      psVar10 = &local_a8;
      local_a8._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"(\\w)+","");
      replaceAll((WebBinder *)psVar10,&local_80,&local_d8,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar11) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/","");
      psVar10 = &local_a8;
      local_a8._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\\/","");
      replaceAll((WebBinder *)psVar10,&local_80,&local_d8,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar11) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_a8,&local_80,0x10);
      _Var3._M_current = (local_88->_M_dataplus)._M_p;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = 0;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + local_88->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_d8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a8,0);
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p,
                        local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
      }
      if (bVar6) {
        (local_b0->_M_dataplus)._M_p = (pointer)local_60;
        pcVar4 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (psVar9 + -1))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)local_b0,pcVar4,pcVar4 + *psVar9);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
LAB_0012076d:
        if (!bVar12) {
          return local_b0;
        }
        break;
      }
      std::__cxx11::string::append((char *)&local_80);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,&local_80,0x10);
      _Var3._M_current = (local_88->_M_dataplus)._M_p;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = 0;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + local_88->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_d8,&local_50,0);
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p,
                        local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
      }
      psVar10 = local_88;
      if (bVar6) {
        std::__cxx11::string::find_last_of((char *)local_88,0x131017,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)psVar10);
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,
                                    (ulong)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(psVar9 + -1))->_M_dataplus)._M_p);
        (local_b0->_M_dataplus)._M_p = (pointer)local_60;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar8) {
          sVar5 = plVar7[3];
          local_60->_M_allocated_capacity = *psVar8;
          *(size_type *)((long)local_60 + 8) = sVar5;
        }
        else {
          (local_b0->_M_dataplus)._M_p = (pointer)*plVar7;
          (local_b0->field_2)._M_allocated_capacity = *psVar8;
        }
        local_b0->_M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) goto LAB_0012076d;
      bVar12 = (pointer)(psVar9 + 3) == local_58;
      psVar9 = psVar9 + 8;
    } while (!bVar12);
  }
  (local_b0->_M_dataplus)._M_p = (pointer)&local_b0->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  return local_b0;
}

Assistant:

std::string WebBinder::getPath(std::string path) {
  
  for (auto &pair : binds) {
    std::string regexString(pair.first);
    replaceAll(regexString, "*", "(\\w)+");
    replaceAll(regexString, "/", "\\/");
    std::regex fileRegex(regexString);
    
    if (std::regex_match(path, fileRegex)) 
      return pair.second;
    
    regexString.append("(\\w)+(\\.(\\w)+)?");
    std::regex dirRegex(regexString);
    if (std::regex_match(path, dirRegex)) 
      return pair.second + path.substr(path.find_last_of("/") + 1, path.length());
  }
  
  return "";
}